

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O0

void Ref_ObjPrint(Aig_Obj_t *pObj)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  uint local_14;
  Aig_Obj_t *pObj_local;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    local_14 = 0xffffffff;
  }
  else {
    pAVar2 = Aig_Regular(pObj);
    local_14 = pAVar2->Id;
  }
  printf("%d",(ulong)local_14);
  if (pObj != (Aig_Obj_t *)0x0) {
    uVar1 = Aig_IsComplement(pObj);
    printf("(%d) ",(ulong)uVar1);
  }
  return;
}

Assistant:

void Ref_ObjPrint( Aig_Obj_t * pObj )
{
    printf( "%d", pObj? Aig_Regular(pObj)->Id : -1 );
    if ( pObj )
        printf( "(%d) ", Aig_IsComplement(pObj) );
}